

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

VectorXd __thiscall mnf::operator-(mnf *this,Point *x,Point *y)

{
  Manifold *this_00;
  size_t size;
  Index extraout_RDX;
  Index outer_stride;
  VectorXd VVar1;
  double *local_98;
  size_t local_90;
  ConstRefVec local_80;
  ConstRefVec local_58;
  
  size = Manifold::dim((x->super_SubPoint).super_ConstSubPoint.manifold_);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (-1 < (long)size) {
    if (size == 0) {
      local_98 = (double *)0x0;
    }
    else {
      local_98 = Eigen::internal::conditional_aligned_new_auto<double,true>(size);
      *(double **)this = local_98;
    }
    *(size_t *)(this + 8) = size;
    this_00 = (x->super_SubPoint).super_ConstSubPoint.manifold_;
    local_90 = size;
    ConstSubPoint::value(&local_58,&(y->super_SubPoint).super_ConstSubPoint);
    ConstSubPoint::value(&local_80,&(x->super_SubPoint).super_ConstSubPoint);
    Manifold::pseudoLog(this_00,(RefVec *)&local_98,&local_58,&local_80);
    free(local_80.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

Eigen::VectorXd operator-(const Point& x, const Point& y)
{
  Eigen::VectorXd output(x.getManifold().dim());
  x.getManifold().pseudoLog(output, y.value(), x.value());
  return output;
}